

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

int skip_tpl_for_frame(GF_GROUP *gf_group,int frame_idx,int gop_eval,int approx_gop_eval,
                      int reduce_num_frames)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  GF_GROUP *in_RDI;
  int in_R8D;
  int gop_length;
  int num_arf_layers;
  int local_4;
  
  iVar1 = 2;
  if (in_EDX == 2) {
    iVar1 = 3;
  }
  iVar2 = get_gop_length(in_RDI);
  if ((in_RDI->update_type[in_ESI] == '\x05') || (in_RDI->update_type[in_ESI] == '\x04')) {
    local_4 = 1;
  }
  else if ((in_ECX == 0) || ((in_RDI->layer_depth[in_ESI] <= iVar1 && (in_ESI < iVar2)))) {
    if ((in_R8D == 0) || ((in_RDI->update_type[in_ESI] != '\x01' || (iVar2 <= in_ESI)))) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static inline int skip_tpl_for_frame(const GF_GROUP *gf_group, int frame_idx,
                                     int gop_eval, int approx_gop_eval,
                                     int reduce_num_frames) {
  // When gop_eval is set to 2, tpl stats calculation is done for ARFs from base
  // layer, (base+1) layer and (base+2) layer. When gop_eval is set to 3,
  // tpl stats calculation is limited to ARFs from base layer and (base+1)
  // layer.
  const int num_arf_layers = (gop_eval == 2) ? 3 : 2;
  const int gop_length = get_gop_length(gf_group);

  if (gf_group->update_type[frame_idx] == INTNL_OVERLAY_UPDATE ||
      gf_group->update_type[frame_idx] == OVERLAY_UPDATE)
    return 1;

  // When approx_gop_eval = 1, skip tpl stats calculation for higher layer
  // frames and for frames beyond gop length.
  if (approx_gop_eval && (gf_group->layer_depth[frame_idx] > num_arf_layers ||
                          frame_idx >= gop_length))
    return 1;

  if (reduce_num_frames && gf_group->update_type[frame_idx] == LF_UPDATE &&
      frame_idx < gop_length)
    return 1;

  return 0;
}